

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

void JSONWorker::DoArray(internalJSONNode *parent,json_string *value_t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  json_string newValue;
  json_string local_70;
  json_string local_50;
  
  sVar2 = value_t->_M_string_length;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DoArray is empty","");
  JSONDebug::_JSON_ASSERT(sVar2 != 0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (*(value_t->_M_dataplus)._M_p == '[') {
    if (2 < value_t->_M_string_length) {
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      sVar4 = 1;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = FindNextRelevant<(char)44>(value_t,1);
      if (sVar3 != 0xffffffffffffffff) {
        sVar4 = 1;
        do {
          std::__cxx11::string::replace
                    ((ulong)&local_70,0,(char *)local_70._M_string_length,
                     (ulong)((value_t->_M_dataplus)._M_p + sVar4));
          sVar4 = FindNextRelevant<(char)58>(&local_70,0);
          if (sVar4 != 0xffffffffffffffff) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"Key/Value pairs are not allowed in arrays","");
            goto LAB_00114a8d;
          }
          if (jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single == '\0') {
            DoArray();
          }
          NewNode(parent,(json_string *)
                         &jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single,&local_70,
                  true);
          sVar4 = sVar3 + 1;
          sVar3 = FindNextRelevant<(char)44>(value_t,sVar4);
        } while (sVar3 != 0xffffffffffffffff);
      }
      std::__cxx11::string::replace
                ((ulong)&local_70,0,(char *)local_70._M_string_length,
                 (ulong)((value_t->_M_dataplus)._M_p + sVar4));
      sVar3 = FindNextRelevant<(char)58>(&local_70,0);
      if (sVar3 == 0xffffffffffffffff) {
        if (jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single == '\0') {
          DoArray();
        }
        NewNode(parent,(json_string *)&jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single
                ,&local_70,true);
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Key/Value pairs are not allowed in arrays","");
LAB_00114a8d:
        JSONDebug::_JSON_FAIL(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        internalJSONNode::Nullify(parent);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"DoArray is not an array","");
    JSONDebug::_JSON_FAIL(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    internalJSONNode::Nullify(parent);
  }
  return;
}

Assistant:

void JSONWorker::DoArray(const internalJSONNode * parent, const json_string & value_t) json_nothrow {
	//This takes an array and creates nodes out of them
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoArray is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('['), JSON_TEXT("DoArray is not an array"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a [] (blank array)
	
	#ifdef JSON_SAFE
		json_string newValue;  //share this so it has a reserved buffer
	#endif
	size_t starting = 1;  //ignore the [
	
	//Not sure what's in the array, so we have to use commas
	for(size_t ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, 1);
		ending != json_string::npos;
		ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, starting)){
		
		#ifdef JSON_SAFE
			newValue.assign(value_t.begin() + starting, value_t.begin() + ending);
			JSON_ASSERT_SAFE(FIND_NEXT_RELEVANT(JSON_TEXT(':'), newValue, 0) == json_string::npos, JSON_TEXT("Key/Value pairs are not allowed in arrays"), parent -> Nullify(); return;);
			NewNode(parent, json_global(EMPTY_JSON_STRING), newValue, true);
		#else
			NewNode(parent, json_global(EMPTY_JSON_STRING), json_string(value_t.begin() + starting, value_t.begin() + ending), true);
		#endif
		starting = ending + 1;
	}
	//since the last one will not find the comma, we have to add it here, but ignore the final ]
	
	#ifdef JSON_SAFE
		newValue.assign(value_t.begin() + starting, value_t.end() - 1);
		JSON_ASSERT_SAFE(FIND_NEXT_RELEVANT(JSON_TEXT(':'), newValue, 0) == json_string::npos, JSON_TEXT("Key/Value pairs are not allowed in arrays"), parent -> Nullify(); return;);
		NewNode(parent, json_global(EMPTY_JSON_STRING), newValue, true);
	#else
		NewNode(parent, json_global(EMPTY_JSON_STRING), json_string(value_t.begin() + starting, value_t.end() - 1), true);
	#endif
}